

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

TextMarkerGenerator * google::protobuf::GetGlobalTextMarkerGenerator(void)

{
  int iVar1;
  
  if (GetGlobalTextMarkerGenerator()::kTextMarkerGenerator == '\0') {
    iVar1 = __cxa_guard_acquire(&GetGlobalTextMarkerGenerator()::kTextMarkerGenerator);
    if (iVar1 != 0) {
      TextMarkerGenerator::CreateRandom();
      __cxa_guard_release(&GetGlobalTextMarkerGenerator()::kTextMarkerGenerator);
    }
  }
  return &GetGlobalTextMarkerGenerator::kTextMarkerGenerator;
}

Assistant:

const TextMarkerGenerator& GetGlobalTextMarkerGenerator() {
  static const TextMarkerGenerator kTextMarkerGenerator =
      TextMarkerGenerator::CreateRandom();
  return kTextMarkerGenerator;
}